

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O1

void Image_Function::Normalize
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  uint uVar1;
  bool bVar2;
  undefined8 uVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  char cVar11;
  byte bVar12;
  uint uVar13;
  undefined1 (*pauVar14) [64];
  long lVar15;
  uchar *puVar16;
  value_type_conflict3 *__val;
  ulong uVar17;
  uchar *puVar18;
  uint uVar19;
  ulong uVar20;
  ushort uVar21;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar22 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar53 [16];
  undefined1 in_XMM19 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> value;
  undefined1 auVar52 [32];
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  bVar12 = CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>(in,out);
  uVar1 = in->_rowSize;
  if (uVar1 * height == 0) {
    uVar19 = 0xff;
    bVar12 = 0;
  }
  else {
    puVar18 = in->_data + (ulong)(bVar12 * startXIn) + (ulong)(uVar1 * startYIn);
    puVar16 = puVar18 + uVar1 * height;
    uVar13 = bVar12 * width;
    auVar26 = vpbroadcastq_avx512f();
    uVar19 = 0xff;
    bVar12 = 0;
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
    auVar29 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
    auVar32 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
    auVar33 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar34 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      if (uVar13 != 0) {
        auVar35 = vpbroadcastb_avx512bw();
        auVar36 = vpbroadcastb_avx512bw();
        uVar17 = 0;
        do {
          auVar37 = vmovdqa64_avx512f(auVar36);
          auVar38 = vmovdqa64_avx512f(auVar35);
          auVar35 = vpbroadcastq_avx512f();
          auVar36 = vporq_avx512f(auVar35,auVar27);
          auVar39 = vporq_avx512f(auVar35,auVar28);
          auVar40 = vporq_avx512f(auVar35,auVar29);
          auVar41 = vporq_avx512f(auVar35,auVar30);
          auVar42 = vporq_avx512f(auVar35,auVar31);
          auVar43 = vporq_avx512f(auVar35,auVar32);
          auVar44 = vporq_avx512f(auVar35,auVar33);
          auVar35 = vporq_avx512f(auVar35,auVar34);
          uVar3 = vpcmpuq_avx512f(auVar35,auVar26,2);
          bVar12 = (byte)uVar3;
          uVar3 = vpcmpuq_avx512f(auVar44,auVar26,2);
          bVar4 = (byte)uVar3;
          uVar3 = vpcmpuq_avx512f(auVar43,auVar26,2);
          bVar5 = (byte)uVar3;
          uVar3 = vpcmpuq_avx512f(auVar42,auVar26,2);
          bVar6 = (byte)uVar3;
          uVar3 = vpcmpuq_avx512f(auVar41,auVar26,2);
          bVar7 = (byte)uVar3;
          uVar3 = vpcmpuq_avx512f(auVar40,auVar26,2);
          bVar8 = (byte)uVar3;
          uVar3 = vpcmpuq_avx512f(auVar39,auVar26,2);
          bVar9 = (byte)uVar3;
          uVar3 = vpcmpuq_avx512f(auVar36,auVar26,2);
          bVar10 = (byte)uVar3;
          uVar21 = CONCAT11(bVar10,bVar9);
          uVar19 = CONCAT22(uVar21,CONCAT11(bVar8,bVar7));
          uVar20 = CONCAT44(uVar19,CONCAT22(CONCAT11(bVar6,bVar5),CONCAT11(bVar4,bVar12)));
          auVar35 = vmovdqu8_avx512bw(*(undefined1 (*) [64])(puVar18 + uVar17));
          auVar36[1] = ((byte)(uVar20 >> 1) & 1) * auVar35[1];
          auVar36[0] = (bVar12 & 1) * auVar35[0];
          auVar36[2] = ((byte)(uVar20 >> 2) & 1) * auVar35[2];
          auVar36[3] = ((byte)(uVar20 >> 3) & 1) * auVar35[3];
          auVar36[4] = ((byte)(uVar20 >> 4) & 1) * auVar35[4];
          auVar36[5] = ((byte)(uVar20 >> 5) & 1) * auVar35[5];
          auVar36[6] = ((byte)(uVar20 >> 6) & 1) * auVar35[6];
          auVar36[7] = ((byte)(uVar20 >> 7) & 1) * auVar35[7];
          auVar36[8] = (bVar4 & 1) * auVar35[8];
          auVar36[9] = ((byte)(uVar20 >> 9) & 1) * auVar35[9];
          auVar36[10] = ((byte)(uVar20 >> 10) & 1) * auVar35[10];
          auVar36[0xb] = ((byte)(uVar20 >> 0xb) & 1) * auVar35[0xb];
          auVar36[0xc] = ((byte)(uVar20 >> 0xc) & 1) * auVar35[0xc];
          auVar36[0xd] = ((byte)(uVar20 >> 0xd) & 1) * auVar35[0xd];
          auVar36[0xe] = ((byte)(uVar20 >> 0xe) & 1) * auVar35[0xe];
          auVar36[0xf] = ((byte)(uVar20 >> 0xf) & 1) * auVar35[0xf];
          auVar36[0x10] = (bVar5 & 1) * auVar35[0x10];
          auVar36[0x11] = ((byte)(uVar20 >> 0x11) & 1) * auVar35[0x11];
          auVar36[0x12] = ((byte)(uVar20 >> 0x12) & 1) * auVar35[0x12];
          auVar36[0x13] = ((byte)(uVar20 >> 0x13) & 1) * auVar35[0x13];
          auVar36[0x14] = ((byte)(uVar20 >> 0x14) & 1) * auVar35[0x14];
          auVar36[0x15] = ((byte)(uVar20 >> 0x15) & 1) * auVar35[0x15];
          auVar36[0x16] = ((byte)(uVar20 >> 0x16) & 1) * auVar35[0x16];
          auVar36[0x17] = ((byte)(uVar20 >> 0x17) & 1) * auVar35[0x17];
          auVar36[0x18] = (bVar6 & 1) * auVar35[0x18];
          auVar36[0x19] = ((byte)(uVar20 >> 0x19) & 1) * auVar35[0x19];
          auVar36[0x1a] = ((byte)(uVar20 >> 0x1a) & 1) * auVar35[0x1a];
          auVar36[0x1b] = ((byte)(uVar20 >> 0x1b) & 1) * auVar35[0x1b];
          auVar36[0x1c] = ((byte)(uVar20 >> 0x1c) & 1) * auVar35[0x1c];
          auVar36[0x1d] = ((byte)(uVar20 >> 0x1d) & 1) * auVar35[0x1d];
          auVar36[0x1e] = ((byte)(uVar20 >> 0x1e) & 1) * auVar35[0x1e];
          auVar36[0x1f] = ((byte)(uVar20 >> 0x1f) & 1) * auVar35[0x1f];
          auVar36[0x20] = (bVar7 & 1) * auVar35[0x20];
          auVar36[0x21] = ((byte)(uVar19 >> 1) & 1) * auVar35[0x21];
          auVar36[0x22] = ((byte)(uVar19 >> 2) & 1) * auVar35[0x22];
          auVar36[0x23] = ((byte)(uVar19 >> 3) & 1) * auVar35[0x23];
          auVar36[0x24] = ((byte)(uVar19 >> 4) & 1) * auVar35[0x24];
          auVar36[0x25] = ((byte)(uVar19 >> 5) & 1) * auVar35[0x25];
          auVar36[0x26] = ((byte)(uVar19 >> 6) & 1) * auVar35[0x26];
          auVar36[0x27] = ((byte)(uVar19 >> 7) & 1) * auVar35[0x27];
          auVar36[0x28] = (bVar8 & 1) * auVar35[0x28];
          auVar36[0x29] = ((byte)(uVar19 >> 9) & 1) * auVar35[0x29];
          auVar36[0x2a] = ((byte)(uVar19 >> 10) & 1) * auVar35[0x2a];
          auVar36[0x2b] = ((byte)(uVar19 >> 0xb) & 1) * auVar35[0x2b];
          auVar36[0x2c] = ((byte)(uVar19 >> 0xc) & 1) * auVar35[0x2c];
          auVar36[0x2d] = ((byte)(uVar19 >> 0xd) & 1) * auVar35[0x2d];
          auVar36[0x2e] = ((byte)(uVar19 >> 0xe) & 1) * auVar35[0x2e];
          auVar36[0x2f] = ((byte)(uVar19 >> 0xf) & 1) * auVar35[0x2f];
          auVar36[0x30] = (bVar9 & 1) * auVar35[0x30];
          auVar36[0x31] = ((byte)(uVar21 >> 1) & 1) * auVar35[0x31];
          auVar36[0x32] = ((byte)(uVar21 >> 2) & 1) * auVar35[0x32];
          auVar36[0x33] = ((byte)(uVar21 >> 3) & 1) * auVar35[0x33];
          auVar36[0x34] = ((byte)(uVar21 >> 4) & 1) * auVar35[0x34];
          auVar36[0x35] = ((byte)(uVar21 >> 5) & 1) * auVar35[0x35];
          auVar36[0x36] = ((byte)(uVar21 >> 6) & 1) * auVar35[0x36];
          auVar36[0x37] = ((byte)(uVar21 >> 7) & 1) * auVar35[0x37];
          auVar36[0x38] = (bVar10 & 1) * auVar35[0x38];
          auVar36[0x39] = (bVar10 >> 1 & 1) * auVar35[0x39];
          auVar36[0x3a] = (bVar10 >> 2 & 1) * auVar35[0x3a];
          auVar36[0x3b] = (bVar10 >> 3 & 1) * auVar35[0x3b];
          auVar36[0x3c] = (bVar10 >> 4 & 1) * auVar35[0x3c];
          auVar36[0x3d] = (bVar10 >> 5 & 1) * auVar35[0x3d];
          auVar36[0x3e] = (bVar10 >> 6 & 1) * auVar35[0x3e];
          cVar11 = (char)bVar10 >> 7;
          auVar36[0x3f] = -cVar11 * auVar35[0x3f];
          auVar35 = vpminub_avx512bw(auVar38,auVar36);
          auVar36 = vpmaxub_avx512bw(auVar37,auVar36);
          uVar17 = uVar17 + 0x40;
        } while (((ulong)uVar13 + 0x3f & 0xffffffffffffffc0) != uVar17);
        auVar36 = vmovdqu8_avx512bw(auVar36);
        auVar25[0] = (bVar12 & 1) * auVar36[0] | !(bool)(bVar12 & 1) * auVar37[0];
        bVar2 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar25[1] = bVar2 * auVar36[1] | !bVar2 * auVar37[1];
        bVar2 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar25[2] = bVar2 * auVar36[2] | !bVar2 * auVar37[2];
        bVar2 = (bool)((byte)(uVar20 >> 3) & 1);
        auVar25[3] = bVar2 * auVar36[3] | !bVar2 * auVar37[3];
        bVar2 = (bool)((byte)(uVar20 >> 4) & 1);
        auVar25[4] = bVar2 * auVar36[4] | !bVar2 * auVar37[4];
        bVar2 = (bool)((byte)(uVar20 >> 5) & 1);
        auVar25[5] = bVar2 * auVar36[5] | !bVar2 * auVar37[5];
        bVar2 = (bool)((byte)(uVar20 >> 6) & 1);
        auVar25[6] = bVar2 * auVar36[6] | !bVar2 * auVar37[6];
        bVar2 = (bool)((byte)(uVar20 >> 7) & 1);
        auVar25[7] = bVar2 * auVar36[7] | !bVar2 * auVar37[7];
        auVar25[8] = (bVar4 & 1) * auVar36[8] | !(bool)(bVar4 & 1) * auVar37[8];
        bVar2 = (bool)((byte)(uVar20 >> 9) & 1);
        auVar25[9] = bVar2 * auVar36[9] | !bVar2 * auVar37[9];
        bVar2 = (bool)((byte)(uVar20 >> 10) & 1);
        auVar25[10] = bVar2 * auVar36[10] | !bVar2 * auVar37[10];
        bVar2 = (bool)((byte)(uVar20 >> 0xb) & 1);
        auVar25[0xb] = bVar2 * auVar36[0xb] | !bVar2 * auVar37[0xb];
        bVar2 = (bool)((byte)(uVar20 >> 0xc) & 1);
        auVar25[0xc] = bVar2 * auVar36[0xc] | !bVar2 * auVar37[0xc];
        bVar2 = (bool)((byte)(uVar20 >> 0xd) & 1);
        auVar25[0xd] = bVar2 * auVar36[0xd] | !bVar2 * auVar37[0xd];
        bVar2 = (bool)((byte)(uVar20 >> 0xe) & 1);
        auVar25[0xe] = bVar2 * auVar36[0xe] | !bVar2 * auVar37[0xe];
        bVar2 = (bool)((byte)(uVar20 >> 0xf) & 1);
        auVar25[0xf] = bVar2 * auVar36[0xf] | !bVar2 * auVar37[0xf];
        auVar25[0x10] = (bVar5 & 1) * auVar36[0x10] | !(bool)(bVar5 & 1) * auVar37[0x10];
        bVar2 = (bool)((byte)(uVar20 >> 0x11) & 1);
        auVar25[0x11] = bVar2 * auVar36[0x11] | !bVar2 * auVar37[0x11];
        bVar2 = (bool)((byte)(uVar20 >> 0x12) & 1);
        auVar25[0x12] = bVar2 * auVar36[0x12] | !bVar2 * auVar37[0x12];
        bVar2 = (bool)((byte)(uVar20 >> 0x13) & 1);
        auVar25[0x13] = bVar2 * auVar36[0x13] | !bVar2 * auVar37[0x13];
        bVar2 = (bool)((byte)(uVar20 >> 0x14) & 1);
        auVar25[0x14] = bVar2 * auVar36[0x14] | !bVar2 * auVar37[0x14];
        bVar2 = (bool)((byte)(uVar20 >> 0x15) & 1);
        auVar25[0x15] = bVar2 * auVar36[0x15] | !bVar2 * auVar37[0x15];
        bVar2 = (bool)((byte)(uVar20 >> 0x16) & 1);
        auVar25[0x16] = bVar2 * auVar36[0x16] | !bVar2 * auVar37[0x16];
        bVar2 = (bool)((byte)(uVar20 >> 0x17) & 1);
        auVar25[0x17] = bVar2 * auVar36[0x17] | !bVar2 * auVar37[0x17];
        auVar25[0x18] = (bVar6 & 1) * auVar36[0x18] | !(bool)(bVar6 & 1) * auVar37[0x18];
        bVar2 = (bool)((byte)(uVar20 >> 0x19) & 1);
        auVar25[0x19] = bVar2 * auVar36[0x19] | !bVar2 * auVar37[0x19];
        bVar2 = (bool)((byte)(uVar20 >> 0x1a) & 1);
        auVar25[0x1a] = bVar2 * auVar36[0x1a] | !bVar2 * auVar37[0x1a];
        bVar2 = (bool)((byte)(uVar20 >> 0x1b) & 1);
        auVar25[0x1b] = bVar2 * auVar36[0x1b] | !bVar2 * auVar37[0x1b];
        bVar2 = (bool)((byte)(uVar20 >> 0x1c) & 1);
        auVar25[0x1c] = bVar2 * auVar36[0x1c] | !bVar2 * auVar37[0x1c];
        bVar2 = (bool)((byte)(uVar20 >> 0x1d) & 1);
        auVar25[0x1d] = bVar2 * auVar36[0x1d] | !bVar2 * auVar37[0x1d];
        bVar2 = (bool)((byte)(uVar20 >> 0x1e) & 1);
        auVar25[0x1e] = bVar2 * auVar36[0x1e] | !bVar2 * auVar37[0x1e];
        bVar2 = (bool)((byte)(uVar20 >> 0x1f) & 1);
        auVar25[0x1f] = bVar2 * auVar36[0x1f] | !bVar2 * auVar37[0x1f];
        auVar39[0x20] = (bVar7 & 1) * auVar36[0x20] | !(bool)(bVar7 & 1) * auVar37[0x20];
        auVar39._0_32_ = auVar25;
        bVar2 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar39[0x21] = bVar2 * auVar36[0x21] | !bVar2 * auVar37[0x21];
        bVar2 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar39[0x22] = bVar2 * auVar36[0x22] | !bVar2 * auVar37[0x22];
        bVar2 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar39[0x23] = bVar2 * auVar36[0x23] | !bVar2 * auVar37[0x23];
        bVar2 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar39[0x24] = bVar2 * auVar36[0x24] | !bVar2 * auVar37[0x24];
        bVar2 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar39[0x25] = bVar2 * auVar36[0x25] | !bVar2 * auVar37[0x25];
        bVar2 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar39[0x26] = bVar2 * auVar36[0x26] | !bVar2 * auVar37[0x26];
        bVar2 = (bool)((byte)(uVar19 >> 7) & 1);
        auVar39[0x27] = bVar2 * auVar36[0x27] | !bVar2 * auVar37[0x27];
        auVar39[0x28] = (bVar8 & 1) * auVar36[0x28] | !(bool)(bVar8 & 1) * auVar37[0x28];
        bVar2 = (bool)((byte)(uVar19 >> 9) & 1);
        auVar39[0x29] = bVar2 * auVar36[0x29] | !bVar2 * auVar37[0x29];
        bVar2 = (bool)((byte)(uVar19 >> 10) & 1);
        auVar39[0x2a] = bVar2 * auVar36[0x2a] | !bVar2 * auVar37[0x2a];
        bVar2 = (bool)((byte)(uVar19 >> 0xb) & 1);
        auVar39[0x2b] = bVar2 * auVar36[0x2b] | !bVar2 * auVar37[0x2b];
        bVar2 = (bool)((byte)(uVar19 >> 0xc) & 1);
        auVar39[0x2c] = bVar2 * auVar36[0x2c] | !bVar2 * auVar37[0x2c];
        bVar2 = (bool)((byte)(uVar19 >> 0xd) & 1);
        auVar39[0x2d] = bVar2 * auVar36[0x2d] | !bVar2 * auVar37[0x2d];
        bVar2 = (bool)((byte)(uVar19 >> 0xe) & 1);
        auVar39[0x2e] = bVar2 * auVar36[0x2e] | !bVar2 * auVar37[0x2e];
        bVar2 = (bool)((byte)(uVar19 >> 0xf) & 1);
        auVar39[0x2f] = bVar2 * auVar36[0x2f] | !bVar2 * auVar37[0x2f];
        auVar39[0x30] = (bVar9 & 1) * auVar36[0x30] | !(bool)(bVar9 & 1) * auVar37[0x30];
        bVar2 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar39[0x31] = bVar2 * auVar36[0x31] | !bVar2 * auVar37[0x31];
        bVar2 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar39[0x32] = bVar2 * auVar36[0x32] | !bVar2 * auVar37[0x32];
        bVar2 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar39[0x33] = bVar2 * auVar36[0x33] | !bVar2 * auVar37[0x33];
        bVar2 = (bool)((byte)(uVar21 >> 4) & 1);
        auVar39[0x34] = bVar2 * auVar36[0x34] | !bVar2 * auVar37[0x34];
        bVar2 = (bool)((byte)(uVar21 >> 5) & 1);
        auVar39[0x35] = bVar2 * auVar36[0x35] | !bVar2 * auVar37[0x35];
        bVar2 = (bool)((byte)(uVar21 >> 6) & 1);
        auVar39[0x36] = bVar2 * auVar36[0x36] | !bVar2 * auVar37[0x36];
        bVar2 = (bool)((byte)(uVar21 >> 7) & 1);
        auVar39[0x37] = bVar2 * auVar36[0x37] | !bVar2 * auVar37[0x37];
        auVar39[0x38] = (bVar10 & 1) * auVar36[0x38] | !(bool)(bVar10 & 1) * auVar37[0x38];
        bVar2 = (bool)(bVar10 >> 1 & 1);
        auVar39[0x39] = bVar2 * auVar36[0x39] | !bVar2 * auVar37[0x39];
        bVar2 = (bool)(bVar10 >> 2 & 1);
        auVar39[0x3a] = bVar2 * auVar36[0x3a] | !bVar2 * auVar37[0x3a];
        bVar2 = (bool)(bVar10 >> 3 & 1);
        auVar39[0x3b] = bVar2 * auVar36[0x3b] | !bVar2 * auVar37[0x3b];
        bVar2 = (bool)(bVar10 >> 4 & 1);
        auVar39[0x3c] = bVar2 * auVar36[0x3c] | !bVar2 * auVar37[0x3c];
        bVar2 = (bool)(bVar10 >> 5 & 1);
        auVar39[0x3d] = bVar2 * auVar36[0x3d] | !bVar2 * auVar37[0x3d];
        bVar2 = (bool)(bVar10 >> 6 & 1);
        auVar39[0x3e] = bVar2 * auVar36[0x3e] | !bVar2 * auVar37[0x3e];
        auVar39[0x3f] = -cVar11 * auVar36[0x3f] | !(bool)-cVar11 * auVar37[0x3f];
        auVar35 = vmovdqu8_avx512bw(auVar35);
        auVar24[0] = (bVar12 & 1) * auVar35[0] | !(bool)(bVar12 & 1) * auVar38[0];
        bVar2 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar24[1] = bVar2 * auVar35[1] | !bVar2 * auVar38[1];
        bVar2 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar24[2] = bVar2 * auVar35[2] | !bVar2 * auVar38[2];
        bVar2 = (bool)((byte)(uVar20 >> 3) & 1);
        auVar24[3] = bVar2 * auVar35[3] | !bVar2 * auVar38[3];
        bVar2 = (bool)((byte)(uVar20 >> 4) & 1);
        auVar24[4] = bVar2 * auVar35[4] | !bVar2 * auVar38[4];
        bVar2 = (bool)((byte)(uVar20 >> 5) & 1);
        auVar24[5] = bVar2 * auVar35[5] | !bVar2 * auVar38[5];
        bVar2 = (bool)((byte)(uVar20 >> 6) & 1);
        auVar24[6] = bVar2 * auVar35[6] | !bVar2 * auVar38[6];
        bVar2 = (bool)((byte)(uVar20 >> 7) & 1);
        auVar24[7] = bVar2 * auVar35[7] | !bVar2 * auVar38[7];
        auVar24[8] = (bVar4 & 1) * auVar35[8] | !(bool)(bVar4 & 1) * auVar38[8];
        bVar2 = (bool)((byte)(uVar20 >> 9) & 1);
        auVar24[9] = bVar2 * auVar35[9] | !bVar2 * auVar38[9];
        bVar2 = (bool)((byte)(uVar20 >> 10) & 1);
        auVar24[10] = bVar2 * auVar35[10] | !bVar2 * auVar38[10];
        bVar2 = (bool)((byte)(uVar20 >> 0xb) & 1);
        auVar24[0xb] = bVar2 * auVar35[0xb] | !bVar2 * auVar38[0xb];
        bVar2 = (bool)((byte)(uVar20 >> 0xc) & 1);
        auVar24[0xc] = bVar2 * auVar35[0xc] | !bVar2 * auVar38[0xc];
        bVar2 = (bool)((byte)(uVar20 >> 0xd) & 1);
        auVar24[0xd] = bVar2 * auVar35[0xd] | !bVar2 * auVar38[0xd];
        bVar2 = (bool)((byte)(uVar20 >> 0xe) & 1);
        auVar24[0xe] = bVar2 * auVar35[0xe] | !bVar2 * auVar38[0xe];
        bVar2 = (bool)((byte)(uVar20 >> 0xf) & 1);
        auVar24[0xf] = bVar2 * auVar35[0xf] | !bVar2 * auVar38[0xf];
        auVar24[0x10] = (bVar5 & 1) * auVar35[0x10] | !(bool)(bVar5 & 1) * auVar38[0x10];
        bVar2 = (bool)((byte)(uVar20 >> 0x11) & 1);
        auVar24[0x11] = bVar2 * auVar35[0x11] | !bVar2 * auVar38[0x11];
        bVar2 = (bool)((byte)(uVar20 >> 0x12) & 1);
        auVar24[0x12] = bVar2 * auVar35[0x12] | !bVar2 * auVar38[0x12];
        bVar2 = (bool)((byte)(uVar20 >> 0x13) & 1);
        auVar24[0x13] = bVar2 * auVar35[0x13] | !bVar2 * auVar38[0x13];
        bVar2 = (bool)((byte)(uVar20 >> 0x14) & 1);
        auVar24[0x14] = bVar2 * auVar35[0x14] | !bVar2 * auVar38[0x14];
        bVar2 = (bool)((byte)(uVar20 >> 0x15) & 1);
        auVar24[0x15] = bVar2 * auVar35[0x15] | !bVar2 * auVar38[0x15];
        bVar2 = (bool)((byte)(uVar20 >> 0x16) & 1);
        auVar24[0x16] = bVar2 * auVar35[0x16] | !bVar2 * auVar38[0x16];
        bVar2 = (bool)((byte)(uVar20 >> 0x17) & 1);
        auVar24[0x17] = bVar2 * auVar35[0x17] | !bVar2 * auVar38[0x17];
        auVar24[0x18] = (bVar6 & 1) * auVar35[0x18] | !(bool)(bVar6 & 1) * auVar38[0x18];
        bVar2 = (bool)((byte)(uVar20 >> 0x19) & 1);
        auVar24[0x19] = bVar2 * auVar35[0x19] | !bVar2 * auVar38[0x19];
        bVar2 = (bool)((byte)(uVar20 >> 0x1a) & 1);
        auVar24[0x1a] = bVar2 * auVar35[0x1a] | !bVar2 * auVar38[0x1a];
        bVar2 = (bool)((byte)(uVar20 >> 0x1b) & 1);
        auVar24[0x1b] = bVar2 * auVar35[0x1b] | !bVar2 * auVar38[0x1b];
        bVar2 = (bool)((byte)(uVar20 >> 0x1c) & 1);
        auVar24[0x1c] = bVar2 * auVar35[0x1c] | !bVar2 * auVar38[0x1c];
        bVar2 = (bool)((byte)(uVar20 >> 0x1d) & 1);
        auVar24[0x1d] = bVar2 * auVar35[0x1d] | !bVar2 * auVar38[0x1d];
        bVar2 = (bool)((byte)(uVar20 >> 0x1e) & 1);
        auVar24[0x1e] = bVar2 * auVar35[0x1e] | !bVar2 * auVar38[0x1e];
        bVar2 = (bool)((byte)(uVar20 >> 0x1f) & 1);
        auVar24[0x1f] = bVar2 * auVar35[0x1f] | !bVar2 * auVar38[0x1f];
        auVar37[0x20] = (bVar7 & 1) * auVar35[0x20] | !(bool)(bVar7 & 1) * auVar38[0x20];
        auVar37._0_32_ = auVar24;
        bVar2 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar37[0x21] = bVar2 * auVar35[0x21] | !bVar2 * auVar38[0x21];
        bVar2 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar37[0x22] = bVar2 * auVar35[0x22] | !bVar2 * auVar38[0x22];
        bVar2 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar37[0x23] = bVar2 * auVar35[0x23] | !bVar2 * auVar38[0x23];
        bVar2 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar37[0x24] = bVar2 * auVar35[0x24] | !bVar2 * auVar38[0x24];
        bVar2 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar37[0x25] = bVar2 * auVar35[0x25] | !bVar2 * auVar38[0x25];
        bVar2 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar37[0x26] = bVar2 * auVar35[0x26] | !bVar2 * auVar38[0x26];
        bVar2 = (bool)((byte)(uVar19 >> 7) & 1);
        auVar37[0x27] = bVar2 * auVar35[0x27] | !bVar2 * auVar38[0x27];
        auVar37[0x28] = (bVar8 & 1) * auVar35[0x28] | !(bool)(bVar8 & 1) * auVar38[0x28];
        bVar2 = (bool)((byte)(uVar19 >> 9) & 1);
        auVar37[0x29] = bVar2 * auVar35[0x29] | !bVar2 * auVar38[0x29];
        bVar2 = (bool)((byte)(uVar19 >> 10) & 1);
        auVar37[0x2a] = bVar2 * auVar35[0x2a] | !bVar2 * auVar38[0x2a];
        bVar2 = (bool)((byte)(uVar19 >> 0xb) & 1);
        auVar37[0x2b] = bVar2 * auVar35[0x2b] | !bVar2 * auVar38[0x2b];
        bVar2 = (bool)((byte)(uVar19 >> 0xc) & 1);
        auVar37[0x2c] = bVar2 * auVar35[0x2c] | !bVar2 * auVar38[0x2c];
        bVar2 = (bool)((byte)(uVar19 >> 0xd) & 1);
        auVar37[0x2d] = bVar2 * auVar35[0x2d] | !bVar2 * auVar38[0x2d];
        bVar2 = (bool)((byte)(uVar19 >> 0xe) & 1);
        auVar37[0x2e] = bVar2 * auVar35[0x2e] | !bVar2 * auVar38[0x2e];
        bVar2 = (bool)((byte)(uVar19 >> 0xf) & 1);
        auVar37[0x2f] = bVar2 * auVar35[0x2f] | !bVar2 * auVar38[0x2f];
        auVar37[0x30] = (bVar9 & 1) * auVar35[0x30] | !(bool)(bVar9 & 1) * auVar38[0x30];
        bVar2 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar37[0x31] = bVar2 * auVar35[0x31] | !bVar2 * auVar38[0x31];
        bVar2 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar37[0x32] = bVar2 * auVar35[0x32] | !bVar2 * auVar38[0x32];
        bVar2 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar37[0x33] = bVar2 * auVar35[0x33] | !bVar2 * auVar38[0x33];
        bVar2 = (bool)((byte)(uVar21 >> 4) & 1);
        auVar37[0x34] = bVar2 * auVar35[0x34] | !bVar2 * auVar38[0x34];
        bVar2 = (bool)((byte)(uVar21 >> 5) & 1);
        auVar37[0x35] = bVar2 * auVar35[0x35] | !bVar2 * auVar38[0x35];
        bVar2 = (bool)((byte)(uVar21 >> 6) & 1);
        auVar37[0x36] = bVar2 * auVar35[0x36] | !bVar2 * auVar38[0x36];
        bVar2 = (bool)((byte)(uVar21 >> 7) & 1);
        auVar37[0x37] = bVar2 * auVar35[0x37] | !bVar2 * auVar38[0x37];
        auVar37[0x38] = (bVar10 & 1) * auVar35[0x38] | !(bool)(bVar10 & 1) * auVar38[0x38];
        bVar2 = (bool)(bVar10 >> 1 & 1);
        auVar37[0x39] = bVar2 * auVar35[0x39] | !bVar2 * auVar38[0x39];
        bVar2 = (bool)(bVar10 >> 2 & 1);
        auVar37[0x3a] = bVar2 * auVar35[0x3a] | !bVar2 * auVar38[0x3a];
        bVar2 = (bool)(bVar10 >> 3 & 1);
        auVar37[0x3b] = bVar2 * auVar35[0x3b] | !bVar2 * auVar38[0x3b];
        bVar2 = (bool)(bVar10 >> 4 & 1);
        auVar37[0x3c] = bVar2 * auVar35[0x3c] | !bVar2 * auVar38[0x3c];
        bVar2 = (bool)(bVar10 >> 5 & 1);
        auVar37[0x3d] = bVar2 * auVar35[0x3d] | !bVar2 * auVar38[0x3d];
        bVar2 = (bool)(bVar10 >> 6 & 1);
        auVar37[0x3e] = bVar2 * auVar35[0x3e] | !bVar2 * auVar38[0x3e];
        auVar37[0x3f] = -cVar11 * auVar35[0x3f] | !(bool)-cVar11 * auVar38[0x3f];
        auVar23 = vextracti64x4_avx512f(auVar37,1);
        auVar24 = vpminub_avx2(auVar24,auVar23);
        auVar22 = vpminub_avx(auVar24._0_16_,auVar24._16_16_);
        auVar48 = vpsrlw_avx(auVar22,8);
        auVar22 = vpminub_avx(auVar22,auVar48);
        auVar22 = vphminposuw_avx(auVar22);
        uVar19 = auVar22._0_4_;
        auVar24 = vextracti64x4_avx512f(auVar39,1);
        auVar24 = vpmaxub_avx2(auVar25,auVar24);
        auVar22 = vpmaxub_avx(auVar24._0_16_,auVar24._16_16_);
        auVar22 = vpternlogq_avx512vl(auVar22,auVar22,auVar22,0xf);
        auVar48 = vpsrlw_avx(auVar22,8);
        auVar22 = vpminub_avx(auVar22,auVar48);
        auVar22 = vphminposuw_avx(auVar22);
        bVar12 = ~auVar22[0];
      }
      puVar18 = puVar18 + uVar1;
    } while (puVar18 != puVar16);
  }
  if ((bVar12 != 0xff || (byte)uVar19 != 0) && ((byte)uVar19 != bVar12)) {
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pauVar14 = (undefined1 (*) [64])operator_new(0x100);
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(pauVar14 + 4);
    auVar27 = ZEXT1664((undefined1  [16])0x0);
    auVar26 = vmovdqu64_avx512f(auVar27);
    *pauVar14 = auVar26;
    auVar26 = vmovdqu64_avx512f(auVar27);
    pauVar14[1] = auVar26;
    auVar26 = vmovdqu64_avx512f(auVar27);
    pauVar14[2] = auVar26;
    auVar26 = vmovdqu64_avx512f(auVar27);
    pauVar14[3] = auVar26;
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pauVar14;
    auVar22 = vcvtsi2sd_avx512f(in_XMM19,(uint)bVar12 - (uVar19 & 0xff));
    auVar22._0_8_ = 255.0 / auVar22._0_8_;
    auVar22._8_8_ = 0;
    auVar26 = vpbroadcastd_avx512f();
    auVar27 = vbroadcastsd_avx512f(auVar22);
    auVar28 = vpmovsxbd_avx512f(_DAT_0011b044);
    auVar29 = vpmovsxbd_avx512f(_DAT_0011b054);
    auVar30 = vpmovsxbd_avx512f(_DAT_0011b064);
    auVar31 = vpmovsxbd_avx512f(_DAT_0011b074);
    lVar15 = 0;
    auVar32 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
    auVar33 = vpbroadcastd_avx512f(ZEXT416(0x40));
    do {
      auVar34 = vpsubd_avx512f(auVar31,auVar26);
      auVar35 = vcvtdq2pd_avx512f(auVar34._0_32_);
      auVar36 = vpsubd_avx512f(auVar30,auVar26);
      auVar37 = vcvtdq2pd_avx512f(auVar36._0_32_);
      auVar38 = vpsubd_avx512f(auVar29,auVar26);
      auVar39 = vcvtdq2pd_avx512f(auVar38._0_32_);
      auVar40 = vpsubd_avx512f(auVar28,auVar26);
      auVar41 = vcvtdq2pd_avx512f(auVar40._0_32_);
      auVar24 = vextracti64x4_avx512f(auVar34,1);
      auVar34 = vcvtdq2pd_avx512f(auVar24);
      auVar24 = vextracti64x4_avx512f(auVar36,1);
      auVar36 = vcvtdq2pd_avx512f(auVar24);
      auVar24 = vextracti64x4_avx512f(auVar38,1);
      auVar38 = vcvtdq2pd_avx512f(auVar24);
      auVar24 = vextracti64x4_avx512f(auVar40,1);
      auVar40 = vcvtdq2pd_avx512f(auVar24);
      auVar40 = vfmadd213pd_avx512f(auVar40,auVar27,auVar32);
      auVar38 = vfmadd213pd_avx512f(auVar38,auVar27,auVar32);
      auVar36 = vfmadd213pd_avx512f(auVar36,auVar27,auVar32);
      auVar34 = vfmadd213pd_avx512f(auVar34,auVar27,auVar32);
      auVar41 = vfmadd213pd_avx512f(auVar41,auVar27,auVar32);
      auVar39 = vfmadd213pd_avx512f(auVar39,auVar27,auVar32);
      auVar37 = vfmadd213pd_avx512f(auVar37,auVar27,auVar32);
      auVar35 = vfmadd213pd_avx512f(auVar35,auVar27,auVar32);
      auVar24 = vcvttpd2dq_avx512f(auVar35);
      auVar22 = vpmovdb_avx512vl(auVar24);
      auVar24 = vcvttpd2dq_avx512f(auVar37);
      auVar48 = vpmovdb_avx512vl(auVar24);
      auVar24 = vcvttpd2dq_avx512f(auVar39);
      auVar49._8_8_ = 0;
      auVar49._0_8_ = auVar48._0_8_;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = auVar22._0_8_;
      auVar22 = vpmovdb_avx512vl(auVar24);
      auVar24 = vcvttpd2dq_avx512f(auVar41);
      auVar48 = vpmovdb_avx512vl(auVar24);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = auVar48._0_8_;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = auVar22._0_8_;
      auVar52._0_16_ = ZEXT116(0) * auVar53 + ZEXT116(1) * auVar50;
      auVar52._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar53;
      auVar35 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                               ZEXT116(1) * auVar49,
                                               ZEXT116(0) * auVar49 + ZEXT116(1) * auVar46)),auVar52
                           ,1);
      auVar24 = vcvttpd2dq_avx512f(auVar34);
      auVar22 = vpmovdb_avx512vl(auVar24);
      auVar24 = vcvttpd2dq_avx512f(auVar36);
      auVar48 = vpmovdb_avx512vl(auVar24);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = auVar48._0_8_;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = auVar22._0_8_;
      auVar24 = vcvttpd2dq_avx512f(auVar38);
      auVar25 = vcvttpd2dq_avx512f(auVar40);
      auVar22 = vpmovdb_avx512vl(auVar24);
      auVar48 = vpmovdb_avx512vl(auVar25);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = auVar48._0_8_;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = auVar22._0_8_;
      auVar23._0_16_ = ZEXT116(0) * auVar51 + ZEXT116(1) * auVar48;
      auVar23._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar51;
      auVar34 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                               ZEXT116(1) * auVar47,
                                               ZEXT116(0) * auVar47 + ZEXT116(1) * auVar45)),auVar23
                           ,1);
      auVar34 = vpunpcklqdq_avx512f(auVar35,auVar34);
      auVar34 = vmovdqu64_avx512f(auVar34);
      *(undefined1 (*) [64])(*pauVar14 + lVar15) = auVar34;
      lVar15 = lVar15 + 0x40;
      auVar31 = vpaddd_avx512f(auVar31,auVar33);
      auVar30 = vpaddd_avx512f(auVar30,auVar33);
      auVar29 = vpaddd_avx512f(auVar29,auVar33);
      auVar28 = vpaddd_avx512f(auVar28,auVar33);
    } while (lVar15 != 0x100);
    LookupTable(in,startXIn,startYIn,out,startXOut,startYOut,width,height,&value);
    operator_delete(pauVar14);
    return;
  }
  Copy(in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  return;
}

Assistant:

void Normalize( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                    uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );

        const uint8_t colorCount = CommonColorCount( in, out );
        const uint32_t rowSizeIn = in.rowSize();

        const uint8_t * inY    = in.data()  + startYIn  * rowSizeIn + startXIn * colorCount;
        const uint8_t * inYEnd = inY + height * rowSizeIn;

        uint8_t minimum = 255;
        uint8_t maximum = 0;

        const uint32_t realWidth = width * colorCount;

        for( ; inY != inYEnd; inY += rowSizeIn ) {
            const uint8_t * inX = inY;
            const uint8_t * inXEnd = inX + realWidth;

            for( ; inX != inXEnd; ++inX ) {
                if( minimum > (*inX) )
                    minimum = (*inX);

                if( maximum < (*inX) )
                    maximum = (*inX);
            }
        }

        if( (minimum == 0 && maximum == 255) || (minimum == maximum) ) {
            Copy( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        }
        else {
            const double correction = 255.0 / (maximum - minimum);

            // We precalculate all values and store them in lookup table
            std::vector < uint8_t > value( 256 );

            for( uint16_t i = 0; i < 256; ++i )
                value[i] = static_cast <uint8_t>((i - minimum) * correction + 0.5);

            LookupTable( in, startXIn, startYIn, out, startXOut, startYOut, width, height, value );
        }
    }